

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstructionHeuristics.cpp
# Opt level: O0

Solution * ConstructionHeuristics::RequestsFirst(Solution *solution)

{
  Turn *this;
  default_random_engine this_00;
  bool bVar1;
  bool bVar2;
  __type _Var3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *pmVar8;
  size_type sVar9;
  Scenario *pSVar10;
  WeekData *pWVar11;
  vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_> *__x;
  vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
  *this_01;
  reference __x_00;
  reference ppTVar12;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>_>_>
  *this_02;
  string *psVar13;
  mapped_type *this_03;
  ShiftType *pSVar14;
  mapped_type *this_04;
  const_reference ppDVar15;
  reference pSVar16;
  Nurse *this_05;
  string *psVar17;
  pointer ppVar18;
  __normal_iterator<ShiftOffRequest_*,_std::vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>_>
  local_1b0;
  const_iterator local_1a8;
  ShiftOffRequest *local_1a0;
  __normal_iterator<ShiftOffRequest_*,_std::vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>_>
  local_198;
  __normal_iterator<ShiftOffRequest_*,_std::vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>_>
  local_190;
  const_iterator local_188;
  string local_180;
  int local_160;
  int local_15c;
  int dayInt;
  ShiftOffRequest shiftOffRequest;
  iterator __end4;
  iterator __begin4;
  vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_> *__range4;
  const_iterator cStack_d8;
  bool cont;
  const_iterator iter;
  int local_c8;
  int i;
  int loop;
  int requiredNurses;
  Turn *turn;
  iterator __end2;
  iterator __begin2;
  vector<Turn_*,_std::allocator<Turn_*>_> *__range2;
  vector<Turn_*,_std::allocator<Turn_*>_> day;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
  *__range1;
  vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_> shiftOffRequests;
  type random;
  uniform_int_distribution<int> distribution;
  duration<long,_std::ratio<1L,_1000000000L>_> local_28;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_20;
  default_random_engine generator;
  Solution *solution_local;
  
  generator._M_x = (unsigned_long)solution;
  distribution._M_param = (param_type)std::chrono::_V2::system_clock::now();
  local_28.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                          *)&distribution);
  uVar7 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_28);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine(&local_20,uVar7 & 0xffffffff);
  pmVar8 = Solution::getNurses_abi_cxx11_((Solution *)generator._M_x);
  sVar9 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
          ::size(pmVar8);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)&random._M_bound_args,0,(int)sVar9 + -1);
  std::
  bind<std::uniform_int_distribution<int>&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
            ((uniform_int_distribution<int> *)
             &shiftOffRequests.super__Vector_base<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
             &random._M_bound_args);
  pSVar10 = Scenario::getInstance();
  pWVar11 = Scenario::getWeekData(pSVar10);
  __x = WeekData::getShiftOffRequests(pWVar11);
  std::vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>::vector
            ((vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_> *)&__range1,__x);
  this_01 = Solution::getTurns((Solution *)generator._M_x);
  __end1 = std::
           vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
           ::begin(this_01);
  day.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::
                vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
                ::end(this_01);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::vector<Turn_*,_std::allocator<Turn_*>_>_*,_std::vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>_>
                                     *)&day.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage), bVar1) {
    __x_00 = __gnu_cxx::
             __normal_iterator<const_std::vector<Turn_*,_std::allocator<Turn_*>_>_*,_std::vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>_>
             ::operator*(&__end1);
    std::vector<Turn_*,_std::allocator<Turn_*>_>::vector
              ((vector<Turn_*,_std::allocator<Turn_*>_> *)&__range2,__x_00);
    __end2 = std::vector<Turn_*,_std::allocator<Turn_*>_>::begin
                       ((vector<Turn_*,_std::allocator<Turn_*>_> *)&__range2);
    turn = (Turn *)std::vector<Turn_*,_std::allocator<Turn_*>_>::end
                             ((vector<Turn_*,_std::allocator<Turn_*>_> *)&__range2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Turn_**,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>
                                       *)&turn), bVar1) {
      ppTVar12 = __gnu_cxx::
                 __normal_iterator<Turn_**,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>::
                 operator*(&__end2);
      this = *ppTVar12;
      pSVar10 = Scenario::getInstance();
      pWVar11 = Scenario::getWeekData(pSVar10);
      this_02 = WeekData::getRequirements_abi_cxx11_(pWVar11);
      psVar13 = Turn::getSkill_abi_cxx11_(this);
      this_03 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>_>_>
                ::at(this_02,psVar13);
      pSVar14 = Turn::getShiftType(this);
      psVar13 = ShiftType::getId_abi_cxx11_(pSVar14);
      this_04 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>
                ::at(this_03,psVar13);
      uVar4 = Turn::getDay(this);
      ppDVar15 = std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>::at
                           (this_04,(ulong)uVar4);
      iVar5 = DayRequirement::getMinimumCoverage(*ppDVar15);
      local_c8 = 0;
      for (iter._M_node._4_4_ = 0; iter._M_node._4_4_ < iVar5;
          iter._M_node._4_4_ = iter._M_node._4_4_ + 1) {
        local_c8 = local_c8 + 1;
        pmVar8 = Solution::getNurses_abi_cxx11_((Solution *)generator._M_x);
        cStack_d8 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
                    ::begin(pmVar8);
        iVar6 = std::
                _Bind<std::uniform_int_distribution<int>(std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>)>
                ::operator()((_Bind<std::uniform_int_distribution<int>(std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>)>
                              *)&shiftOffRequests.
                                 super__Vector_base<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        advance<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,NurseSolution*>>,int>
                  (&stack0xffffffffffffff28,iVar6);
        bVar1 = false;
        __end4 = std::vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>::begin
                           ((vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_> *)&__range1);
        shiftOffRequest.day.field_2._8_8_ =
             std::vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>::end
                       ((vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_> *)&__range1);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<ShiftOffRequest_*,_std::vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>_>
                                           *)((long)&shiftOffRequest.day.field_2 + 8)), bVar2) {
          pSVar16 = __gnu_cxx::
                    __normal_iterator<ShiftOffRequest_*,_std::vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>_>
                    ::operator*(&__end4);
          ShiftOffRequest::ShiftOffRequest((ShiftOffRequest *)&dayInt,pSVar16);
          psVar13 = ShiftOffRequest::getNurse_abi_cxx11_((ShiftOffRequest *)&dayInt);
          ppVar18 = std::
                    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>
                    ::operator->(&stack0xffffffffffffff28);
          this_05 = NurseSolution::getNurse(ppVar18->second);
          psVar17 = Nurse::getId_abi_cxx11_(this_05);
          _Var3 = std::operator==(psVar13,psVar17);
          if (_Var3) {
            local_15c = 0xb;
          }
          else {
            pSVar10 = Scenario::getInstance();
            psVar13 = ShiftOffRequest::getDay_abi_cxx11_((ShiftOffRequest *)&dayInt);
            std::__cxx11::string::string((string *)&local_180,(string *)psVar13);
            iVar6 = Scenario::getDayOfWeek(pSVar10,&local_180);
            std::__cxx11::string::~string((string *)&local_180);
            local_160 = iVar6;
            iVar6 = Turn::getDay(this);
            if (iVar6 == local_160) {
              psVar13 = ShiftOffRequest::getShiftType_abi_cxx11_((ShiftOffRequest *)&dayInt);
              bVar2 = std::operator==(psVar13,"Any");
              if (!bVar2) {
                psVar13 = ShiftOffRequest::getShiftType_abi_cxx11_((ShiftOffRequest *)&dayInt);
                pSVar14 = Turn::getShiftType(this);
                psVar17 = ShiftType::getId_abi_cxx11_(pSVar14);
                _Var3 = std::operator==(psVar13,psVar17);
                if (!_Var3) goto LAB_0013dc73;
              }
              bVar1 = true;
              local_198._M_current =
                   (ShiftOffRequest *)
                   std::vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>::begin
                             ((vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_> *)&__range1
                             );
              local_1a0 = (ShiftOffRequest *)
                          std::vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>::end
                                    ((vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_> *)
                                     &__range1);
              local_190 = std::
                          remove<__gnu_cxx::__normal_iterator<ShiftOffRequest*,std::vector<ShiftOffRequest,std::allocator<ShiftOffRequest>>>,ShiftOffRequest>
                                    (local_198,
                                     (__normal_iterator<ShiftOffRequest_*,_std::vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>_>
                                      )local_1a0,(ShiftOffRequest *)&dayInt);
              __gnu_cxx::
              __normal_iterator<ShiftOffRequest_const*,std::vector<ShiftOffRequest,std::allocator<ShiftOffRequest>>>
              ::__normal_iterator<ShiftOffRequest*>
                        ((__normal_iterator<ShiftOffRequest_const*,std::vector<ShiftOffRequest,std::allocator<ShiftOffRequest>>>
                          *)&local_188,&local_190);
              local_1b0._M_current =
                   (ShiftOffRequest *)
                   std::vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>::end
                             ((vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_> *)&__range1
                             );
              __gnu_cxx::
              __normal_iterator<ShiftOffRequest_const*,std::vector<ShiftOffRequest,std::allocator<ShiftOffRequest>>>
              ::__normal_iterator<ShiftOffRequest*>
                        ((__normal_iterator<ShiftOffRequest_const*,std::vector<ShiftOffRequest,std::allocator<ShiftOffRequest>>>
                          *)&local_1a8,&local_1b0);
              std::vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>::erase
                        ((vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_> *)&__range1,
                         local_188,local_1a8);
              local_15c = 10;
            }
            else {
LAB_0013dc73:
              local_15c = 0;
            }
          }
          ShiftOffRequest::~ShiftOffRequest((ShiftOffRequest *)&dayInt);
          if ((local_15c != 0) && (local_15c == 10)) break;
          __gnu_cxx::
          __normal_iterator<ShiftOffRequest_*,_std::vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>_>
          ::operator++(&__end4);
        }
        this_00._M_x = generator._M_x;
        if (bVar1) {
          iter._M_node._4_4_ = iter._M_node._4_4_ + -1;
        }
        else {
          ppVar18 = std::
                    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>
                    ::operator->(&stack0xffffffffffffff28);
          bVar1 = Solution::assignNurseToTurn((Solution *)this_00._M_x,ppVar18->second,this);
          if (!bVar1) {
            iter._M_node._4_4_ = iter._M_node._4_4_ + -1;
          }
          pmVar8 = Solution::getNurses_abi_cxx11_((Solution *)generator._M_x);
          sVar9 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
                  ::size(pmVar8);
          if (sVar9 * 2 < (ulong)(long)local_c8) {
            solution_local = (Solution *)0x0;
            local_15c = 1;
            goto LAB_0013ddc1;
          }
        }
      }
      __gnu_cxx::__normal_iterator<Turn_**,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>::
      operator++(&__end2);
    }
    local_15c = 0;
LAB_0013ddc1:
    std::vector<Turn_*,_std::allocator<Turn_*>_>::~vector
              ((vector<Turn_*,_std::allocator<Turn_*>_> *)&__range2);
    if (local_15c != 0) goto LAB_0013de09;
    __gnu_cxx::
    __normal_iterator<const_std::vector<Turn_*,_std::allocator<Turn_*>_>_*,_std::vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>_>
    ::operator++(&__end1);
  }
  solution_local = (Solution *)generator._M_x;
  local_15c = 1;
LAB_0013de09:
  std::vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>::~vector
            ((vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_> *)&__range1);
  return solution_local;
}

Assistant:

Solution* ConstructionHeuristics::RequestsFirst(Solution* solution){
    default_random_engine generator((unsigned int) chrono::system_clock::now().time_since_epoch().count());
    uniform_int_distribution<int> distribution(0, (int) solution->getNurses().size()-1);

    auto random = bind(distribution, generator);

    vector<ShiftOffRequest> shiftOffRequests = Scenario::getInstance()->getWeekData().getShiftOffRequests();


    for (vector<Turn *> day : solution->getTurns())
        for (Turn *turn : day) {
            int requiredNurses = Scenario::getInstance()->getWeekData().getRequirements().at(turn->getSkill()).at(turn->getShiftType()->getId()).at((unsigned int)turn->getDay())->getMinimumCoverage();
            int loop = 0;
            outerLoop: for(int i = 0; i < requiredNurses;i++)
            {
                loop++;
                auto iter = solution->getNurses().begin();
                std::advance( iter, random() );
                //check if nurse requested day off
                bool cont = false;

                for(ShiftOffRequest shiftOffRequest: shiftOffRequests) {
                    if(shiftOffRequest.getNurse() == iter->second->getNurse()->getId())
                        continue;
                    int dayInt = Scenario::getInstance()->getDayOfWeek(shiftOffRequest.getDay());
                    if(turn->getDay() == dayInt && (shiftOffRequest.getShiftType() == "Any" || shiftOffRequest.getShiftType() == turn->getShiftType()->getId())) {
                        cont = true;
                        shiftOffRequests.erase(std::remove(shiftOffRequests.begin(), shiftOffRequests.end(), shiftOffRequest), shiftOffRequests.end());
                        break;
                    }
                }
                if(cont){
                    i--;
                    continue;
                }
                if(!solution->assignNurseToTurn(iter->second, turn))
                    i--;
                if(loop > solution->getNurses().size()*2)
                    return nullptr;
            }
        }
    return solution;
}